

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention::forward
          (MultiHeadAttention *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  Mat *this_00;
  size_t sVar5;
  long lVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  int *piVar10;
  long lVar11;
  int j_1;
  int iVar12;
  long lVar13;
  long lVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  void *pvVar18;
  ulong uVar19;
  int j_2;
  int _w;
  long lVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  int j;
  ulong uVar25;
  void *pvVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  void *pvVar37;
  bool bVar38;
  float sum;
  float fVar39;
  float fVar40;
  float fVar41;
  long local_2b0;
  long local_2a0;
  void *local_298;
  void *local_288;
  void *local_280;
  void *local_278;
  Mat local_1b8;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  bVar38 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar4 == 0x48;
  lVar35 = 0x48;
  if (bVar38) {
    lVar35 = 0;
  }
  lVar13 = 0x90;
  if (bVar38) {
    lVar13 = 0;
  }
  uVar1 = pMVar4->h;
  uVar19 = (ulong)uVar1;
  uVar29 = (long)this->embed_dim / (long)this->num_head;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->embed_dim,uVar1,4,opt->blob_allocator);
  iVar12 = -1;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    _w = (int)uVar29;
    Mat::create(&local_78,_w,uVar1,this->num_head,4,opt->workspace_allocator);
    local_c8.cstep = 0;
    local_c8.data = (void *)0x0;
    local_c8.refcount._0_4_ = 0;
    local_c8.refcount._4_4_ = 0;
    local_c8.elemsize._0_4_ = 0;
    local_c8.elemsize._4_4_ = 0;
    local_c8.elempack = 0;
    local_c8.allocator = (Allocator *)0x0;
    local_c8.dims = 0;
    local_c8.w = 0;
    local_c8.h = 0;
    local_c8.d = 0;
    local_c8.c = 0;
    Mat::create(&local_c8,_w,uVar1,this->num_head,4,opt->workspace_allocator);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118.elemsize._4_4_ = 0;
    local_118.elempack = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    Mat::create(&local_118,uVar1,_w,this->num_head,4,opt->workspace_allocator);
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar1,uVar1,this->num_head,4,opt->workspace_allocator);
    local_1b8.cstep = 0;
    local_1b8.data = (void *)0x0;
    local_1b8.refcount._0_4_ = 0;
    local_1b8.refcount._4_4_ = 0;
    local_1b8.elemsize._0_4_ = 0;
    local_1b8.elemsize._4_4_ = 0;
    local_1b8.elempack = 0;
    local_1b8.allocator = (Allocator *)0x0;
    local_1b8.dims = 0;
    local_1b8.w = 0;
    local_1b8.h = 0;
    local_1b8.d = 0;
    local_1b8.c = 0;
    Mat::create(&local_1b8,_w,this->num_head,uVar1,4,opt->workspace_allocator);
    pvVar37 = local_78.data;
    pvVar22 = local_c8.data;
    pvVar9 = local_118.data;
    pvVar8 = local_168.data;
    pvVar7 = local_1b8.data;
    iVar12 = this->num_head;
    if (0 < (long)iVar12) {
      lVar16 = local_78.cstep * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      lVar27 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      lVar17 = local_c8.cstep * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar36 = (long)local_c8.w * CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
      lVar21 = local_118.cstep * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
      lVar28 = (long)local_118.w * CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize)
      ;
      lVar23 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
      lVar30 = (long)local_168.w * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
      ;
      lVar24 = (long)local_1b8.w;
      lVar11 = CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize);
      lVar32 = local_1b8.cstep * lVar11;
      lVar14 = (long)_w;
      uVar29 = uVar29 & 0xffffffff;
      local_2a0 = 0;
      local_278 = local_118.data;
      local_288 = local_168.data;
      local_280 = local_78.data;
      local_2b0 = 0;
      do {
        if ((int)uVar1 < 1) {
          local_298 = (void *)(lVar17 * local_2b0 + (long)pvVar22);
        }
        else {
          iVar2 = this->embed_dim;
          pvVar18 = (this->q_bias_data).data;
          pvVar26 = (this->q_weight_data).data;
          uVar25 = 0;
          do {
            if (0 < _w) {
              iVar3 = pMVar4->w;
              sVar5 = pMVar4->elemsize;
              pvVar15 = pMVar4->data;
              uVar33 = 0;
              pvVar31 = (void *)(local_2a0 * iVar2 + (long)pvVar26);
              do {
                fVar39 = *(float *)((long)pvVar18 + (local_2b0 * lVar14 + uVar33) * 4);
                if (0 < iVar2) {
                  lVar20 = 0;
                  do {
                    fVar39 = fVar39 + *(float *)((long)pvVar31 + lVar20 * 4) *
                                      *(float *)((long)pvVar15 +
                                                lVar20 * 4 + sVar5 * uVar25 * (long)iVar3);
                    lVar20 = lVar20 + 1;
                  } while (iVar2 != (int)lVar20);
                }
                *(float *)((long)pvVar37 + uVar33 * 4 + lVar27 * uVar25 + lVar16 * local_2b0) =
                     fVar39 * (1.0 / SQRT((float)_w));
                uVar33 = uVar33 + 1;
                pvVar31 = (void *)((long)pvVar31 + (long)iVar2 * 4);
              } while (uVar33 != uVar29);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar19);
          local_298 = (void *)(lVar17 * local_2b0 + (long)pvVar22);
          if (0 < (int)uVar1) {
            iVar2 = this->embed_dim;
            pvVar18 = (this->k_bias_data).data;
            pvVar26 = (this->k_weight_data).data;
            uVar25 = 0;
            do {
              if (0 < _w) {
                iVar3 = *(int *)((long)&pMVar4->w + lVar35);
                lVar20 = *(long *)((long)&pMVar4->elemsize + lVar35);
                lVar6 = *(long *)((long)&pMVar4->data + lVar35);
                uVar33 = 0;
                pvVar15 = (void *)(local_2a0 * iVar2 + (long)pvVar26);
                do {
                  fVar39 = *(float *)((long)pvVar18 + (uVar33 + local_2b0 * lVar14) * 4);
                  if (0 < iVar2) {
                    lVar34 = 0;
                    do {
                      fVar39 = fVar39 + *(float *)((long)pvVar15 + lVar34 * 4) *
                                        *(float *)(lVar20 * uVar25 * (long)iVar3 + lVar6 +
                                                  lVar34 * 4);
                      lVar34 = lVar34 + 1;
                    } while (iVar2 != (int)lVar34);
                  }
                  *(float *)((long)local_298 + uVar33 * 4 + lVar36 * uVar25) = fVar39;
                  uVar33 = uVar33 + 1;
                  pvVar15 = (void *)((long)pvVar15 + (long)iVar2 * 4);
                } while (uVar33 != uVar29);
              }
              uVar25 = uVar25 + 1;
            } while (uVar25 != uVar19);
          }
        }
        if (0 < _w) {
          iVar2 = this->embed_dim;
          pvVar18 = (this->v_bias_data).data;
          pvVar26 = (void *)(local_2a0 * iVar2 + (long)(this->v_weight_data).data);
          uVar25 = 0;
          do {
            if (0 < (int)uVar1) {
              lVar20 = *(long *)((long)&pMVar4->data + lVar13);
              iVar3 = *(int *)((long)&pMVar4->w + lVar13);
              lVar6 = *(long *)((long)&pMVar4->elemsize + lVar13);
              uVar33 = 0;
              do {
                fVar39 = *(float *)((long)pvVar18 + (uVar25 + local_2b0 * lVar14) * 4);
                if (0 < iVar2) {
                  lVar34 = 0;
                  do {
                    fVar39 = fVar39 + *(float *)((long)pvVar26 + lVar34 * 4) *
                                      *(float *)(lVar20 + lVar34 * 4);
                    lVar34 = lVar34 + 1;
                  } while (iVar2 != (int)lVar34);
                }
                *(float *)((long)pvVar9 + uVar33 * 4 + lVar28 * uVar25 + lVar21 * local_2b0) =
                     fVar39;
                uVar33 = uVar33 + 1;
                lVar20 = lVar20 + iVar3 * lVar6;
              } while (uVar33 != uVar19);
            }
            uVar25 = uVar25 + 1;
            pvVar26 = (void *)((long)pvVar26 + (long)iVar2 * 4);
          } while (uVar25 != uVar29);
        }
        if (0 < (int)uVar1) {
          uVar25 = 0;
          pvVar18 = local_280;
          do {
            uVar33 = 0;
            pvVar26 = local_298;
            do {
              fVar39 = 0.0;
              if (0 < _w) {
                lVar20 = 0;
                do {
                  fVar39 = fVar39 + *(float *)((long)pvVar26 + lVar20 * 4) *
                                    *(float *)((long)pvVar18 + lVar20 * 4);
                  lVar20 = lVar20 + 1;
                } while (_w != (int)lVar20);
              }
              *(float *)((long)pvVar8 + uVar33 * 4 + lVar30 * uVar25 + lVar23 * local_2b0) = fVar39;
              uVar33 = uVar33 + 1;
              pvVar26 = (void *)((long)pvVar26 + lVar36);
            } while (uVar33 != uVar19);
            uVar25 = uVar25 + 1;
            pvVar18 = (void *)((long)pvVar18 + lVar27);
          } while (uVar25 != uVar19);
          if (0 < (int)uVar1) {
            uVar25 = 0;
            pvVar18 = local_288;
            do {
              uVar33 = 0;
              fVar39 = -3.4028235e+38;
              do {
                fVar41 = *(float *)((long)pvVar18 + uVar33 * 4);
                if (fVar39 <= fVar41) {
                  fVar39 = fVar41;
                }
                uVar33 = uVar33 + 1;
              } while (uVar19 != uVar33);
              fVar41 = 0.0;
              uVar33 = 0;
              do {
                fVar40 = expf(*(float *)((long)pvVar18 + uVar33 * 4) - fVar39);
                *(float *)((long)pvVar18 + uVar33 * 4) = fVar40;
                fVar41 = fVar41 + fVar40;
                uVar33 = uVar33 + 1;
              } while (uVar19 != uVar33);
              uVar33 = 0;
              do {
                *(float *)((long)pvVar18 + uVar33 * 4) =
                     *(float *)((long)pvVar18 + uVar33 * 4) * (1.0 / fVar41);
                uVar33 = uVar33 + 1;
              } while (uVar19 != uVar33);
              uVar25 = uVar25 + 1;
              pvVar18 = (void *)((long)pvVar18 + lVar30);
            } while (uVar25 != uVar19);
            if (0 < (int)uVar1) {
              uVar25 = 0;
              pvVar18 = local_288;
              do {
                if (0 < _w) {
                  uVar33 = 0;
                  pvVar26 = local_278;
                  do {
                    fVar39 = 0.0;
                    lVar20 = 0;
                    do {
                      fVar39 = fVar39 + *(float *)((long)pvVar26 + lVar20 * 4) *
                                        *(float *)((long)pvVar18 + lVar20 * 4);
                      lVar20 = lVar20 + 1;
                    } while (uVar1 != (uint)lVar20);
                    *(float *)((long)pvVar7 +
                              uVar33 * 4 + lVar32 * uVar25 + lVar24 * lVar11 * local_2b0) = fVar39;
                    uVar33 = uVar33 + 1;
                    pvVar26 = (void *)((long)pvVar26 + lVar28);
                  } while (uVar33 != uVar29);
                }
                uVar25 = uVar25 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar30);
              } while (uVar25 != uVar19);
            }
          }
        }
        local_2b0 = local_2b0 + 1;
        local_2a0 = local_2a0 + lVar14 * 4;
        local_280 = (void *)((long)local_280 + lVar16);
        local_288 = (void *)((long)local_288 + lVar23);
        local_278 = (void *)((long)local_278 + lVar21);
      } while (local_2b0 != iVar12);
    }
    if (0 < (int)uVar1) {
      pvVar7 = this_00->data;
      iVar12 = this_00->w;
      sVar5 = this_00->elemsize;
      uVar1 = this->embed_dim;
      pvVar8 = (this->out_weight_data).data;
      pvVar9 = (this->out_bias_data).data;
      uVar29 = 0;
      pvVar22 = local_1b8.data;
      do {
        if (0 < (int)uVar1) {
          uVar25 = 0;
          pvVar37 = pvVar8;
          do {
            fVar39 = *(float *)((long)pvVar9 + uVar25 * 4);
            lVar35 = 0;
            do {
              fVar39 = fVar39 + *(float *)((long)pvVar37 + lVar35 * 4) *
                                *(float *)((long)pvVar22 + lVar35 * 4);
              lVar35 = lVar35 + 1;
            } while (uVar1 != (uint)lVar35);
            *(float *)((long)pvVar7 + uVar25 * 4 + (long)iVar12 * sVar5 * uVar29) = fVar39;
            uVar25 = uVar25 + 1;
            pvVar37 = (void *)((long)pvVar37 + (long)(int)uVar1 * 4);
          } while (uVar25 != uVar1);
        }
        uVar29 = uVar29 + 1;
        pvVar22 = (void *)((long)pvVar22 +
                          local_1b8.cstep *
                          CONCAT44(local_1b8.elemsize._4_4_,(undefined4)local_1b8.elemsize));
      } while (uVar29 != uVar19);
    }
    piVar10 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_1b8.allocator == (Allocator *)0x0) {
          if (local_1b8.data != (void *)0x0) {
            free(local_1b8.data);
          }
        }
        else {
          (*(local_1b8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar10 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int MultiHeadAttention::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[1];
    const Mat& v_blob = bottom_blobs.size() == 1 ? q_blob : bottom_blobs[2];

    const int seqlen = q_blob.h;
    const int embed_dim_per_head = embed_dim / num_head;

    Mat& top_blob = top_blobs[0];
    top_blob.create(embed_dim, seqlen, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -1;

    Mat xq(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xk(embed_dim_per_head, seqlen, num_head, 4u, opt.workspace_allocator);
    Mat xv(seqlen, embed_dim_per_head, num_head, 4u, opt.workspace_allocator);

    Mat xqk(seqlen, seqlen, num_head, 4u, opt.workspace_allocator);

    Mat xqkv(embed_dim_per_head, num_head, seqlen, 4u, opt.workspace_allocator);

    const float inv_sqrt_embed_dim_per_head = 1.f / sqrt(embed_dim_per_head);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_head; q++)
    {
        // xq = affine(q) * inv_sqrt_embed_dim_per_head
        {
            Mat outm = xq.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = q_blob.row(i);
                    const float* kptr = (const float*)q_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = q_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum * inv_sqrt_embed_dim_per_head;
                }
            }
        }

        // xk = affine(k)
        {
            Mat outm = xk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* ptr = k_blob.row(i);
                    const float* kptr = (const float*)k_weight_data + embed_dim * (q * embed_dim_per_head + j);

                    float sum = k_bias_data[q * embed_dim_per_head + j];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // xv = affine(v)
        {
            Mat outm = xv.channel(q);

            for (int i = 0; i < embed_dim_per_head; i++)
            {
                for (int j = 0; j < seqlen; j++)
                {
                    const float* ptr = v_blob.row(j);
                    const float* kptr = (const float*)v_weight_data + embed_dim * (q * embed_dim_per_head + i);

                    float sum = v_bias_data[q * embed_dim_per_head + i];
                    for (int k = 0; k < embed_dim; k++)
                    {
                        sum += *ptr++ * *kptr++;
                    }

                    float* outptr = outm.row(i);

                    outptr[j] = sum;
                }
            }
        }

        // xqk = xq * xk
        // xq  (embed_dim_per_head, seqlen)
        // xk  (embed_dim_per_head, seqlen)
        {
            const Mat xqm = xq.channel(q);
            const Mat xkm = xk.channel(q);

            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = outm.row(i);

                for (int j = 0; j < seqlen; j++)
                {
                    const float* qptr = xqm.row(i);
                    const float* kptr = xkm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < embed_dim_per_head; k++)
                    {
                        sum += *qptr++ * *kptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }

        // softmax(xqk)
        {
            Mat outm = xqk.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* ptr = outm.row(i);

                float max = -FLT_MAX;
                for (int j = 0; j < seqlen; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] = (float)(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j = 0; j < seqlen; j++)
                {
                    ptr[j] /= sum;
                }
            }
        }

        // xqkv = xqk * xv
        // xqk (seqlen, seqlen)
        // xv  (seqlen, embed_dim_per_head)
        // out (embed_dim_per_head, num_head, seqlen)
        {
            const Mat xqkm = xqk.channel(q);
            const Mat xvm = xv.channel(q);

            for (int i = 0; i < seqlen; i++)
            {
                float* outptr = xqkv.channel(i).row(q);

                for (int j = 0; j < embed_dim_per_head; j++)
                {
                    const float* qkptr = xqkm.row(i);
                    const float* vptr = xvm.row(j);

                    float sum = 0.f;
                    for (int k = 0; k < seqlen; k++)
                    {
                        sum += *qkptr++ * *vptr++;
                    }

                    outptr[j] = sum;
                }
            }
        }
    }

    // out = affine(xqkv)
    // xqkv  (embed_dim, seqlen)
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < seqlen; i++)
    {
        float* outptr = top_blob.row(i);

        for (int j = 0; j < embed_dim; j++)
        {
            const float* ptr = xqkv.channel(i);
            const float* kptr = (const float*)out_weight_data + embed_dim * j;

            float sum = out_bias_data[j];
            for (int k = 0; k < embed_dim; k++)
            {
                sum += *ptr++ * *kptr++;
            }

            outptr[j] = sum;
        }
    }

    return 0;
}